

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
pstack::ReaderArray<Elf64_Sym,_42UL>::ReaderArray
          (ReaderArray<Elf64_Sym,_42UL> *this,Reader *reader_,size_t offset)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar2;
  Exception *this_00;
  Exception local_1b8;
  
  this->reader = reader_;
  this->base = offset;
  this->cacheStart = 0;
  this->cacheEnd = 0;
  iVar1 = (*reader_->_vptr_Reader[8])(reader_);
  this->eof = (CONCAT44(extraout_var,iVar1) - this->base) / 0x18;
  iVar1 = (*this->reader->_vptr_Reader[8])();
  if (CONCAT44(extraout_var_00,iVar1) != -1) {
    iVar1 = (*this->reader->_vptr_Reader[8])();
    uVar2 = CONCAT44(extraout_var_01,iVar1) * -0x5555555555555555;
    if (0xaaaaaaaaaaaaaaa < (uVar2 >> 3 | uVar2 << 0x3d)) {
      this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset(&local_1b8,0,0x1a0);
      Exception::Exception(&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b8.str,"end of data while reading array",0x1f);
      Exception::Exception(this_00,&local_1b8);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return;
}

Assistant:

ReaderArray(const Reader &reader_, size_t offset = 0) :
         reader(reader_),
         base(offset),
         eof( ( reader.size() - base ) / sizeof(T) ) {
      if(reader.size() != std::numeric_limits<size_t>::max() && reader.size() % sizeof (T) != 0) {
         throw ( Exception() << "end of data while reading array" );
      }
   }